

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KcpTcpEventLoopThreadPool.cpp
# Opt level: O0

void __thiscall
sznet::net::KcpTcpEventLoopThreadPool::KcpTcpEventLoopThreadPool
          (KcpTcpEventLoopThreadPool *this,KcpTcpEventLoop *baseLoop,
          vector<sznet::net::InetAddress,_std::allocator<sznet::net::InetAddress>_> *udpListenAddrs,
          string *nameArg)

{
  string *nameArg_local;
  vector<sznet::net::InetAddress,_std::allocator<sznet::net::InetAddress>_> *udpListenAddrs_local;
  KcpTcpEventLoop *baseLoop_local;
  KcpTcpEventLoopThreadPool *this_local;
  
  this->m_baseLoop = baseLoop;
  std::__cxx11::string::string((string *)&this->m_name,(string *)nameArg);
  this->m_started = false;
  this->m_numThreads = 0;
  this->m_next = 0;
  std::
  vector<std::unique_ptr<sznet::net::KcpTcpEventLoopThread,_std::default_delete<sznet::net::KcpTcpEventLoopThread>_>,_std::allocator<std::unique_ptr<sznet::net::KcpTcpEventLoopThread,_std::default_delete<sznet::net::KcpTcpEventLoopThread>_>_>_>
  ::vector(&this->m_threads);
  std::vector<sznet::net::KcpTcpEventLoop_*,_std::allocator<sznet::net::KcpTcpEventLoop_*>_>::vector
            (&this->m_loops);
  std::vector<sznet::net::InetAddress,_std::allocator<sznet::net::InetAddress>_>::vector
            (&this->m_udpListenAddrs,udpListenAddrs);
  return;
}

Assistant:

KcpTcpEventLoopThreadPool::KcpTcpEventLoopThreadPool(KcpTcpEventLoop* baseLoop, const std::vector<InetAddress>& udpListenAddrs, const string& nameArg) :
	m_baseLoop(baseLoop),
	m_name(nameArg),
	m_started(false),
	m_numThreads(0),
	m_next(0),
	m_udpListenAddrs(udpListenAddrs)
{
}